

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O1

char * sapp_get_dropped_file_path(wchar_t index)

{
  char *pcVar1;
  
  if (!_sapp.drop.enabled) {
    __assert_fail("_sapp.drop.enabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                  ,0x2f6c,"const char *sapp_get_dropped_file_path(int)");
  }
  if ((L'\xffffffff' < index) && (index < _sapp.drop.num_files)) {
    if (_sapp.drop.buffer == (char *)0x0) {
      __assert_fail("_sapp.drop.buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                    ,0x2f6e,"const char *sapp_get_dropped_file_path(int)");
    }
    if (index < _sapp.drop.max_files) {
      if (_sapp.drop.buf_size <= (int)((long)index * (long)_sapp.drop.max_path_length)) {
        __assert_fail("offset < _sapp.drop.buf_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                      ,0xb29,"char *_sapp_dropped_file_path_ptr(int)");
      }
      pcVar1 = _sapp.drop.buffer + (long)index * (long)_sapp.drop.max_path_length;
    }
    else {
      pcVar1 = "";
    }
    return pcVar1;
  }
  __assert_fail("(index >= 0) && (index < _sapp.drop.num_files)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                ,0x2f6d,"const char *sapp_get_dropped_file_path(int)");
}

Assistant:

SOKOL_API_IMPL const char* sapp_get_dropped_file_path(int index) {
    SOKOL_ASSERT(_sapp.drop.enabled);
    SOKOL_ASSERT((index >= 0) && (index < _sapp.drop.num_files));
    SOKOL_ASSERT(_sapp.drop.buffer);
    if (!_sapp.drop.enabled) {
        return "";
    }
    if ((index < 0) || (index >= _sapp.drop.max_files)) {
        return "";
    }
    return (const char*) _sapp_dropped_file_path_ptr(index);
}